

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_get_asn1_parameters(EVP_CIPHER_CTX *ctx,ASN1_TYPE *params)

{
  int iVar1;
  undefined8 uVar2;
  size_t ukm_offset;
  void *pvVar3;
  uchar *in_RSI;
  size_t in_RDI;
  uchar iv [16];
  int iv_len;
  gost_grasshopper_cipher_ctx_ctr *ctr;
  undefined1 auStackY_38 [16];
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar2 = EVP_CIPHER_CTX_get0_cipher(in_RDI);
  iVar1 = EVP_CIPHER_get_mode(uVar2);
  if (iVar1 == 5) {
    ukm_offset = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    iVar4 = 0x10;
    iVar1 = gost2015_get_asn1_params
                      ((ASN1_TYPE *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,in_RSI,ukm_offset,(uchar *)CONCAT44(0x10,in_stack_ffffffffffffffd8));
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      pvVar3 = (void *)EVP_CIPHER_CTX_iv_noconst(in_RDI);
      memcpy(pvVar3,auStackY_38,(long)iVar4);
      pvVar3 = (void *)EVP_CIPHER_CTX_original_iv(in_RDI);
      memcpy(pvVar3,auStackY_38,(long)iVar4);
      *(undefined4 *)(ukm_offset + 0x1a8) = 0x40000;
      iVar1 = 1;
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static GRASSHOPPER_INLINE int
gost_grasshopper_get_asn1_parameters(EVP_CIPHER_CTX *ctx, ASN1_TYPE *params)
{
    if (EVP_CIPHER_CTX_mode(ctx) == EVP_CIPH_CTR_MODE) {
        gost_grasshopper_cipher_ctx_ctr *ctr = EVP_CIPHER_CTX_get_cipher_data(ctx);

        int iv_len = 16;
        unsigned char iv[16];

        if (gost2015_get_asn1_params(params, 16, iv, 8, ctr->kdf_seed) == 0) {
            return 0;
        }

        memcpy(EVP_CIPHER_CTX_iv_noconst(ctx), iv, iv_len);
        memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), iv, iv_len);

        /* CMS implies 256kb section_size */
        ctr->section_size = 256*1024;
        return 1;
    }
    return 0;
}